

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::ForkBranch<kj::Own<capnp::PipelineHook>_>_>::dispose
          (Own<kj::_::ForkBranch<kj::Own<capnp::PipelineHook>_>_> *this)

{
  ForkBranch<kj::Own<capnp::PipelineHook>_> *object;
  ForkBranch<kj::Own<capnp::PipelineHook>_> *ptrCopy;
  Own<kj::_::ForkBranch<kj::Own<capnp::PipelineHook>_>_> *this_local;
  
  object = this->ptr;
  if (object != (ForkBranch<kj::Own<capnp::PipelineHook>_> *)0x0) {
    this->ptr = (ForkBranch<kj::Own<capnp::PipelineHook>_> *)0x0;
    Disposer::dispose<kj::_::ForkBranch<kj::Own<capnp::PipelineHook>>>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }